

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

long __thiscall gl4cts::BasicBufferOperations::Run(BasicBufferOperations *this)

{
  void *pvVar1;
  uint local_70;
  uint local_6c;
  GLuint i_6;
  GLuint i_5;
  GLuint i_4;
  GLuint i_3;
  GLuint i_2;
  GLuint i_1;
  GLuint data [8];
  BasicBufferOperations *local_30;
  long res;
  GLuint i;
  GLuint *ptr;
  BasicBufferOperations *this_local;
  
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->buffer_);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->buffer_);
  glu::CallLogWrapper::glBufferData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0x20,(void *)0x0,0x88e4);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->buffer_);
  pvVar1 = glu::CallLogWrapper::glMapBuffer
                     (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                       super_CallLogWrapper,0x92c0,0x88b9);
  for (res._4_4_ = 0; res._4_4_ < 8; res._4_4_ = res._4_4_ + 1) {
    *(uint *)((long)pvVar1 + (ulong)res._4_4_ * 4) = res._4_4_;
  }
  glu::CallLogWrapper::glUnmapBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  local_30 = (BasicBufferOperations *)0x0;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,this->buffer_);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0,0x20,&i_2);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
             0x92c0,0);
  for (i_3 = 0; i_3 < 8; i_3 = i_3 + 1) {
    if ((&i_2)[i_3] != i_3) {
      gl4cts::anon_unknown_0::Output
                ("data[%u] is: %u should be: %u\n",(ulong)i_3,(ulong)(&i_2)[i_3],(ulong)i_3);
      local_30 = (BasicBufferOperations *)&DAT_ffffffffffffffff;
    }
  }
  if (local_30 == (BasicBufferOperations *)0x0) {
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->buffer_);
    pvVar1 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,0x20,2);
    for (i_4 = 0; i_4 < 8; i_4 = i_4 + 1) {
      *(GLuint *)((long)pvVar1 + (ulong)i_4 * 4) = i_4 << 1;
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->buffer_);
    pvVar1 = glu::CallLogWrapper::glMapBufferRange
                       (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.
                         super_CallLogWrapper,0x92c0,0,0x20,1);
    for (i_5 = 0; i_5 < 8; i_5 = i_5 + 1) {
      if (*(int *)((long)pvVar1 + (ulong)i_5 * 4) != i_5 * 2) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",(ulong)i_5,(ulong)(&i_2)[i_5],(ulong)(i_5 << 1)
                  );
        local_30 = (BasicBufferOperations *)&DAT_ffffffffffffffff;
      }
    }
    glu::CallLogWrapper::glUnmapBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,this->buffer_);
    for (i_6 = 0; i_6 < 8; i_6 = i_6 + 1) {
      (&i_2)[i_6] = i_6 * 3;
    }
    glu::CallLogWrapper::glBufferSubData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0,0x20,&i_2);
    for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
      (&i_2)[local_6c] = 0;
    }
    glu::CallLogWrapper::glGetBufferSubData
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0,0x20,&i_2);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_SACSubcaseBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
               0x92c0,0);
    for (local_70 = 0; local_70 < 8; local_70 = local_70 + 1) {
      if ((&i_2)[local_70] != local_70 * 3) {
        gl4cts::anon_unknown_0::Output
                  ("data[%u] is: %u should be: %u\n",(ulong)local_70,(ulong)(&i_2)[local_70],
                   (ulong)(local_70 * 3));
        local_30 = (BasicBufferOperations *)&DAT_ffffffffffffffff;
      }
    }
    this_local = local_30;
  }
  else {
    this_local = local_30;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		glGenBuffers(1, &buffer_);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glBufferData(GL_ATOMIC_COUNTER_BUFFER, 8 * 4, NULL, GL_STATIC_DRAW);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		GLuint* ptr = static_cast<GLuint*>(glMapBuffer(GL_ATOMIC_COUNTER_BUFFER, GL_WRITE_ONLY));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		long   res = NO_ERROR;
		GLuint data[8];
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i);
				res = ERROR;
			}
		}
		if (res != NO_ERROR)
			return res;

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_WRITE_BIT));
		for (GLuint i = 0; i < 8; ++i)
			ptr[i]	= i * 2;
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		ptr = static_cast<GLuint*>(glMapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, 32, GL_MAP_READ_BIT));
		for (GLuint i = 0; i < 8; ++i)
		{
			if (ptr[i] != i * 2)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 2);
				res = ERROR;
			}
		}
		glUnmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);

		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer_);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = i * 3;
		glBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, 32, data);
		for (GLuint i = 0; i < 8; ++i)
			data[i]   = 0;
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, 0, sizeof(data), data);
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, 0);
		for (GLuint i = 0; i < 8; ++i)
		{
			if (data[i] != i * 3)
			{
				Output("data[%u] is: %u should be: %u\n", i, data[i], i * 3);
				res = ERROR;
			}
		}

		return res;
	}